

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledStreamWriter::writeValue(StyledStreamWriter *this,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ValueType VVar3;
  Json *pJVar4;
  Value *pVVar5;
  Json *this_00;
  char *value_00;
  LargestUInt value_01;
  char *value_02;
  LargestInt value_03;
  char *pcVar6;
  pointer key;
  double value_04;
  Members members;
  string local_68;
  Members local_48;
  
  pVVar5 = value;
  VVar3 = Value::type(value);
  switch(VVar3) {
  case nullValue:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00543c2f;
  case intValue:
    this_00 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_68,this_00,value_03);
    pushValue(this,&local_68);
    break;
  case uintValue:
    pJVar4 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_01);
    pushValue(this,&local_68);
    break;
  case realValue:
    value_04 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)pVVar5,value_04);
    pushValue(this,&local_68);
    break;
  case stringValue:
    pJVar4 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar4,value_00);
    pushValue(this,&local_68);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    pcVar6 = "false";
    if (bVar2) {
      pcVar6 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar6,pcVar6 + ((ulong)bVar2 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_00543c2f;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) goto LAB_00543d01;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>
                (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append
                ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        pVVar5 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar5);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(key->_M_dataplus)._M_p,value_02);
        writeIndent(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->document_," : ",3);
        writeValue(this,pVVar5);
        key = key + 1;
        if (key == local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,",",1);
        writeCommentAfterValueOnSameLine(this,pVVar5);
      }
      writeCommentAfterValueOnSameLine(this,pVVar5);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>
                (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00543d01:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_00543a1b_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00543c2f:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_00543a1b_default:
  return;
}

Assistant:

void StyledStreamWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
    pushValue(valueToQuotedString(value.asCString()));
    break;
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        *document_ << " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}